

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void recall_execute(CHAR_DATA *ch,ROOM_INDEX_DATA *location)

{
  bool bVar1;
  int iVar2;
  char *txt;
  
  if ((ch->fighting == (CHAR_DATA *)0x0) && (ch->disrupted != true)) {
    ch->move = (short)((uint)(int)(short)(ch->move - (ch->move >> 0xf)) >> 1);
    iVar2 = number_percent();
    if (0x28 < iVar2) {
      bVar1 = is_affected_by(ch,10);
      if (bVar1) {
        txt = "The power of the curse laid upon you dissipates the magic of the spell.\n\r";
        goto LAB_002b1bf3;
      }
    }
    bVar1 = is_affected(ch,(int)gsn_camouflage);
    if (bVar1) {
      switchD_002dea30::default(ch,(int)gsn_camouflage);
      act("$n steps out from $s cover.",ch,(void *)0x0,(void *)0x0,0);
      send_to_char("You step out from your cover.\n\r",ch);
    }
    un_watermeld(ch,(char *)0x0);
    act("As the magic takes effect, a black haze clouds your mind.\n\rWhen it passes, you find yourself elsewhere."
        ,ch,(void *)0x0,(void *)0x0,3);
    act("$n suddenly disappears.",ch,(void *)0x0,(void *)0x0,0);
    char_from_room(ch);
    char_to_room(ch,location);
    act("$n suddenly appears in the room.",ch,(void *)0x0,(void *)0x0,0);
    do_look(ch,"auto");
    check_plasma_thread(ch,-1);
    return;
  }
  txt = "The magic of the recall spell dissipates as your focus is disrupted.\n\r";
LAB_002b1bf3:
  send_to_char(txt,ch);
  return;
}

Assistant:

void recall_execute(CHAR_DATA *ch, ROOM_INDEX_DATA *location)
{
	if (ch->fighting || ch->disrupted)
	{
		send_to_char("The magic of the recall spell dissipates as your focus is disrupted.\n\r", ch);
		return;
	}

	ch->move /= 2;

	if (number_percent() > 40 && is_affected_by(ch, AFF_CURSE))
	{
		send_to_char("The power of the curse laid upon you dissipates the magic of the spell.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_camouflage))
	{
		affect_strip(ch, gsn_camouflage);
		act("$n steps out from $s cover.", ch, 0, 0, TO_ROOM);
		send_to_char("You step out from your cover.\n\r", ch);
	}

	un_watermeld(ch, nullptr);

	act("As the magic takes effect, a black haze clouds your mind.\n\rWhen it passes, you find yourself elsewhere.", ch, 0, 0, TO_CHAR);
	act("$n suddenly disappears.", ch, nullptr, nullptr, TO_ROOM);

	char_from_room(ch);
	char_to_room(ch, location);

	act("$n suddenly appears in the room.", ch, nullptr, nullptr, TO_ROOM);

	do_look(ch, "auto");
	check_plasma_thread(ch, -1);
}